

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,2,0,false>>
          (detail *this,basic_string_view<char> fmt,
          format_string_checker<char,_2,_0,_false> *handler)

{
  compile_parse_context<char> *this_00;
  size_t *psVar1;
  char *pcVar2;
  uint uVar3;
  detail *pdVar4;
  format_string_checker<char,_2,_0,_false> *pfVar5;
  detail *pdVar6;
  detail *end;
  detail dVar7;
  id_adapter local_40;
  
  pfVar5 = (format_string_checker<char,_2,_0,_false> *)fmt.size_;
  if (fmt.data_ != (char *)0x0) {
    end = (detail *)(fmt.data_ + (long)this);
    this_00 = &pfVar5->context_;
    do {
      pdVar6 = this + 1;
      if (*this == (detail)0x7d) {
        if ((pdVar6 == end) || (*pdVar6 != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        goto LAB_0015d058;
      }
      if (*this == (detail)0x7b) {
        if (pdVar6 == end) {
          report_error("invalid format string");
        }
        dVar7 = *pdVar6;
        if (dVar7 == (detail)0x3a) {
          uVar3 = compile_parse_context<char>::next_arg_id(this_00);
          pdVar4 = pdVar6;
LAB_0015d0e2:
          pdVar4 = pdVar4 + 1;
          pcVar2 = (pfVar5->context_).super_parse_context<char>.fmt_.data_;
          (pfVar5->context_).super_parse_context<char>.fmt_.data_ = (char *)pdVar4;
          psVar1 = &(pfVar5->context_).super_parse_context<char>.fmt_.size_;
          *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pdVar4));
          pdVar6 = pdVar4;
          if (uVar3 < 2) {
            pdVar4 = (detail *)(*pfVar5->parse_funcs_[uVar3])(&this_00->super_parse_context<char>);
          }
          else {
            for (; (pdVar6 != end && (pdVar4 = pdVar6, *pdVar6 != (detail)0x7d));
                pdVar6 = pdVar6 + 1) {
              pdVar4 = end;
            }
          }
          if ((pdVar4 == end) || (*pdVar4 != (detail)0x7d)) {
            report_error("unknown format specifier");
          }
          pdVar6 = pdVar4 + 1;
        }
        else {
          if (dVar7 != (detail)0x7b) {
            if (dVar7 != (detail)0x7d) {
              local_40.arg_id = 0;
              local_40.handler = pfVar5;
              pdVar4 = (detail *)
                       parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_string_checker<char,2,0,false>&>(char_const*,char_const*,fmt::v11::detail::format_string_checker<char,2,0,false>&)::id_adapter&>
                                 ((char *)pdVar6,(char *)end,&local_40);
              uVar3 = local_40.arg_id;
              if (pdVar4 == end) {
                dVar7 = (detail)0x0;
              }
              else {
                dVar7 = *pdVar4;
              }
              if (dVar7 == (detail)0x7d) {
                pcVar2 = (pfVar5->context_).super_parse_context<char>.fmt_.data_;
                (pfVar5->context_).super_parse_context<char>.fmt_.data_ = (char *)pdVar4;
                psVar1 = &(pfVar5->context_).super_parse_context<char>.fmt_.size_;
                *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pdVar4));
                if ((uint)local_40.arg_id < 2) {
                  (*pfVar5->parse_funcs_[(uint)local_40.arg_id])
                            (&this_00->super_parse_context<char>);
                }
                this = pdVar4 + 1;
              }
              else if (dVar7 != (detail)0x3a) {
                report_error("missing \'}\' in format string");
              }
              pdVar6 = this;
              if (dVar7 == (detail)0x7d) goto LAB_0015d132;
              goto LAB_0015d0e2;
            }
            uVar3 = compile_parse_context<char>::next_arg_id(this_00);
            pcVar2 = (pfVar5->context_).super_parse_context<char>.fmt_.data_;
            (pfVar5->context_).super_parse_context<char>.fmt_.data_ = (char *)pdVar6;
            psVar1 = &(pfVar5->context_).super_parse_context<char>.fmt_.size_;
            *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pdVar6));
            if (uVar3 < 2) {
              (*pfVar5->parse_funcs_[uVar3])(&this_00->super_parse_context<char>);
            }
          }
LAB_0015d058:
          pdVar6 = this + 2;
        }
      }
LAB_0015d132:
      this = pdVar6;
    } while (pdVar6 != end);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}